

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  GridSOA *pGVar29;
  uint uVar30;
  ulong uVar31;
  ulong *puVar32;
  GridSOA *pGVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_b90;
  GridSOA *local_af8;
  ulong local_af0;
  ulong local_ae8;
  undefined1 local_ae0 [16];
  ulong local_ac8;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  RTCFilterFunctionNArguments local_a60;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  GridSOA **local_8e0;
  char local_8d8;
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar75 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar76 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar77 = ZEXT1664(auVar36);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar78 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar79 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 * 0.99999964)));
  auVar80 = ZEXT1664(auVar36);
  fVar7 = fVar7 * 1.0000004;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar36._4_4_ = iVar10;
  auVar36._0_4_ = iVar10;
  auVar36._8_4_ = iVar10;
  auVar36._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar70._4_4_ = iVar10;
  auVar70._0_4_ = iVar10;
  auVar70._8_4_ = iVar10;
  auVar70._12_4_ = iVar10;
  local_a10 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_b90 = local_7f8;
LAB_01ce554d:
  do {
    puVar32 = local_b90;
    if (puVar32 == &local_800) {
LAB_01ce60aa:
      return puVar32 != &local_800;
    }
    local_b90 = puVar32 + -1;
    uVar28 = puVar32[-1];
    while( true ) {
      local_a70 = auVar75._0_16_;
      local_aa0 = auVar78._0_16_;
      local_a80 = auVar76._0_16_;
      local_ab0 = auVar79._0_16_;
      local_a90 = auVar77._0_16_;
      local_ac0 = auVar80._0_16_;
      if ((uVar28 & 8) != 0) break;
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar34),local_a70);
      auVar37 = vmulps_avx512vl(local_aa0,auVar37);
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar35),local_a80);
      auVar38 = vmulps_avx512vl(local_ab0,auVar38);
      auVar37 = vmaxps_avx(auVar37,auVar38);
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar27),local_a90);
      auVar38 = vmulps_avx512vl(local_ac0,auVar38);
      auVar38 = vmaxps_avx(auVar38,auVar36);
      auVar37 = vmaxps_avx(auVar37,auVar38);
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar34 ^ 0x10)),local_a70);
      auVar61._0_4_ = fVar7 * auVar38._0_4_;
      auVar61._4_4_ = fVar7 * auVar38._4_4_;
      auVar61._8_4_ = fVar7 * auVar38._8_4_;
      auVar61._12_4_ = fVar7 * auVar38._12_4_;
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar35 ^ 0x10)),local_a80);
      auVar62._0_4_ = fVar8 * auVar38._0_4_;
      auVar62._4_4_ = fVar8 * auVar38._4_4_;
      auVar62._8_4_ = fVar8 * auVar38._8_4_;
      auVar62._12_4_ = fVar8 * auVar38._12_4_;
      auVar38 = vminps_avx(auVar61,auVar62);
      auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar27 ^ 0x10)),local_a90);
      auVar63._0_4_ = fVar9 * auVar39._0_4_;
      auVar63._4_4_ = fVar9 * auVar39._4_4_;
      auVar63._8_4_ = fVar9 * auVar39._8_4_;
      auVar63._12_4_ = fVar9 * auVar39._12_4_;
      auVar39 = vminps_avx(auVar63,auVar70);
      auVar38 = vminps_avx(auVar38,auVar39);
      uVar31 = vcmpps_avx512vl(auVar37,auVar38,2);
      if ((char)uVar31 == '\0') goto LAB_01ce554d;
      uVar26 = uVar28 & 0xfffffffffffffff0;
      lVar23 = 0;
      for (uVar28 = uVar31; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar28 = *(ulong *)(uVar26 + lVar23 * 8);
      uVar30 = (uint)uVar31 - 1 & (uint)uVar31;
      uVar31 = (ulong)uVar30;
      if (uVar30 != 0) {
        do {
          *local_b90 = uVar28;
          local_b90 = local_b90 + 1;
          lVar23 = 0;
          for (uVar28 = uVar31; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar31 = uVar31 - 1 & uVar31;
          uVar28 = *(ulong *)(uVar26 + lVar23 * 8);
        } while (uVar31 != 0);
      }
    }
    if (((uint)uVar28 & 0xf) != 8) {
      pGVar29 = (GridSOA *)(uVar28 & 0xfffffffffffffff0);
      uVar28 = *(ulong *)(pGVar29 + (ulong)*(uint *)(pGVar29 + 0x2c) + 0x30);
      (pre->super_Precalculations).grid = pGVar29;
      if (uVar28 != 0) {
        *local_b90 = uVar28;
        local_b90 = local_b90 + 1;
      }
      goto LAB_01ce554d;
    }
    pGVar29 = (pre->super_Precalculations).grid;
    uVar30 = *(uint *)(pGVar29 + 0xc);
    local_af0 = (ulong)uVar30;
    uVar15 = *(uint *)(pGVar29 + 0x10);
    local_ae8 = (ulong)uVar15;
    uVar16 = *(uint *)(pGVar29 + 0x24);
    uVar28 = uVar28 >> 4;
    lVar23 = uVar28 * 4 + (ulong)uVar16;
    auVar37 = *(undefined1 (*) [16])(pGVar29 + local_af0 * 4 + lVar23 + 0x2c);
    auVar38 = auVar37;
    if (2 < local_ae8) {
      auVar38 = *(undefined1 (*) [16])(pGVar29 + local_af0 * 8 + uVar28 * 4 + (ulong)uVar16 + 0x2c);
    }
    auVar39 = *(undefined1 (*) [16])(pGVar29 + uVar28 * 4 + (ulong)uVar16 + 0x2c);
    if (local_af0 == 2) {
      auVar39 = vshufps_avx(auVar39,auVar39,0x54);
      auVar37 = vshufps_avx(auVar37,auVar37,0x54);
      auVar38 = vshufps_avx(auVar38,auVar38,0x54);
    }
    uVar28 = (ulong)*(uint *)(pGVar29 + 0x14);
    pGVar33 = pGVar29 + uVar28 * 4 + lVar23 + 0x2c;
    auVar61 = *(undefined1 (*) [16])(pGVar33 + local_af0 * 4);
    auVar62 = auVar61;
    if (2 < uVar15) {
      auVar62 = *(undefined1 (*) [16])(pGVar33 + local_af0 * 8);
    }
    auVar63 = *(undefined1 (*) [16])pGVar33;
    if (uVar30 == 2) {
      auVar63 = vshufps_avx(auVar63,auVar63,0x54);
      auVar61 = vshufps_avx(auVar61,auVar61,0x54);
      auVar62 = vshufps_avx(auVar62,auVar62,0x54);
    }
    pGVar33 = pGVar29 + uVar28 * 8 + lVar23 + 0x2c;
    auVar13 = *(undefined1 (*) [16])(pGVar33 + local_af0 * 4);
    auVar67 = auVar13;
    if (2 < uVar15) {
      auVar67 = *(undefined1 (*) [16])(pGVar33 + local_af0 * 8);
    }
    auVar14 = *(undefined1 (*) [16])pGVar33;
    if (uVar30 == 2) {
      auVar14 = vshufps_avx(auVar14,auVar14,0x54);
      auVar13 = vshufps_avx(auVar13,auVar13,0x54);
      auVar67 = vshufps_avx(auVar67,auVar67,0x54);
    }
    local_af8 = pGVar29 + uVar28 * 0xc + lVar23 + 0x2c;
    auVar64._16_16_ = auVar37;
    auVar64._0_16_ = auVar39;
    auVar60._16_16_ = auVar38;
    auVar60._0_16_ = auVar37;
    auVar69 = vunpcklps_avx(auVar64,auVar60);
    auVar58 = vshufps_avx(auVar64,auVar64,0xa5);
    auVar42 = vshufps_avx(auVar60,auVar60,0x94);
    auVar44._16_16_ = auVar61;
    auVar44._0_16_ = auVar63;
    auVar43._16_16_ = auVar62;
    auVar43._0_16_ = auVar61;
    auVar60 = vunpcklps_avx(auVar44,auVar43);
    auVar59 = vshufps_avx(auVar44,auVar44,0xa5);
    auVar55 = vshufps_avx(auVar43,auVar43,0x94);
    auVar46._16_16_ = auVar13;
    auVar46._0_16_ = auVar14;
    auVar45._16_16_ = auVar67;
    auVar45._0_16_ = auVar13;
    auVar64 = vunpcklps_avx(auVar46,auVar45);
    auVar53 = vshufps_avx(auVar46,auVar46,0xa5);
    uVar11 = *(undefined4 *)(ray + k * 4);
    auVar47._4_4_ = uVar11;
    auVar47._0_4_ = uVar11;
    auVar47._8_4_ = uVar11;
    auVar47._12_4_ = uVar11;
    auVar47._16_4_ = uVar11;
    auVar47._20_4_ = uVar11;
    auVar47._24_4_ = uVar11;
    auVar47._28_4_ = uVar11;
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar48._4_4_ = uVar11;
    auVar48._0_4_ = uVar11;
    auVar48._8_4_ = uVar11;
    auVar48._12_4_ = uVar11;
    auVar48._16_4_ = uVar11;
    auVar48._20_4_ = uVar11;
    auVar48._24_4_ = uVar11;
    auVar48._28_4_ = uVar11;
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar49._4_4_ = uVar11;
    auVar49._0_4_ = uVar11;
    auVar49._8_4_ = uVar11;
    auVar49._12_4_ = uVar11;
    auVar49._16_4_ = uVar11;
    auVar49._20_4_ = uVar11;
    auVar49._24_4_ = uVar11;
    auVar49._28_4_ = uVar11;
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar68._4_4_ = uVar11;
    auVar68._0_4_ = uVar11;
    auVar68._8_4_ = uVar11;
    auVar68._12_4_ = uVar11;
    auVar68._16_4_ = uVar11;
    auVar68._20_4_ = uVar11;
    auVar68._24_4_ = uVar11;
    auVar68._28_4_ = uVar11;
    auVar40 = vshufps_avx512vl(auVar45,auVar45,0x94);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar71._4_4_ = uVar11;
    auVar71._0_4_ = uVar11;
    auVar71._8_4_ = uVar11;
    auVar71._12_4_ = uVar11;
    auVar71._16_4_ = uVar11;
    auVar71._20_4_ = uVar11;
    auVar71._24_4_ = uVar11;
    auVar71._28_4_ = uVar11;
    fVar12 = *(float *)(ray + k * 4 + 0x60);
    auVar73._4_4_ = fVar12;
    auVar73._0_4_ = fVar12;
    auVar73._8_4_ = fVar12;
    auVar73._12_4_ = fVar12;
    auVar73._16_4_ = fVar12;
    auVar73._20_4_ = fVar12;
    auVar73._24_4_ = fVar12;
    auVar73._28_4_ = fVar12;
    auVar69 = vsubps_avx(auVar69,auVar47);
    auVar60 = vsubps_avx(auVar60,auVar48);
    auVar64 = vsubps_avx(auVar64,auVar49);
    auVar58 = vsubps_avx(auVar58,auVar47);
    auVar41 = vsubps_avx512vl(auVar59,auVar48);
    auVar59 = vsubps_avx(auVar53,auVar49);
    auVar42 = vsubps_avx512vl(auVar42,auVar47);
    auVar43 = vsubps_avx512vl(auVar55,auVar48);
    auVar40 = vsubps_avx512vl(auVar40,auVar49);
    auVar44 = vsubps_avx512vl(auVar42,auVar69);
    auVar45 = vsubps_avx512vl(auVar43,auVar60);
    auVar46 = vsubps_avx512vl(auVar40,auVar64);
    auVar47 = vsubps_avx512vl(auVar69,auVar58);
    auVar48 = vsubps_avx512vl(auVar60,auVar41);
    auVar49 = vsubps_avx512vl(auVar64,auVar59);
    auVar50 = vsubps_avx512vl(auVar58,auVar42);
    auVar51 = vsubps_avx512vl(auVar41,auVar43);
    auVar52 = vsubps_avx512vl(auVar59,auVar40);
    auVar53 = vaddps_avx512vl(auVar42,auVar69);
    auVar54 = vaddps_avx512vl(auVar43,auVar60);
    auVar55 = vaddps_avx512vl(auVar40,auVar64);
    auVar56 = vmulps_avx512vl(auVar54,auVar46);
    auVar56 = vfmsub231ps_avx512vl(auVar56,auVar45,auVar55);
    auVar55 = vmulps_avx512vl(auVar55,auVar44);
    auVar57 = vfmsub231ps_avx512vl(auVar55,auVar46,auVar53);
    auVar55._4_4_ = auVar45._4_4_ * auVar53._4_4_;
    auVar55._0_4_ = auVar45._0_4_ * auVar53._0_4_;
    auVar55._8_4_ = auVar45._8_4_ * auVar53._8_4_;
    auVar55._12_4_ = auVar45._12_4_ * auVar53._12_4_;
    auVar55._16_4_ = auVar45._16_4_ * auVar53._16_4_;
    auVar55._20_4_ = auVar45._20_4_ * auVar53._20_4_;
    auVar55._24_4_ = auVar45._24_4_ * auVar53._24_4_;
    auVar55._28_4_ = auVar53._28_4_;
    auVar37 = vfmsub231ps_fma(auVar55,auVar44,auVar54);
    auVar54._0_4_ = fVar12 * auVar37._0_4_;
    auVar54._4_4_ = fVar12 * auVar37._4_4_;
    auVar54._8_4_ = fVar12 * auVar37._8_4_;
    auVar54._12_4_ = fVar12 * auVar37._12_4_;
    auVar54._16_4_ = fVar12 * 0.0;
    auVar54._20_4_ = fVar12 * 0.0;
    auVar54._24_4_ = fVar12 * 0.0;
    auVar54._28_4_ = 0;
    auVar55 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar57);
    local_940 = vfmadd231ps_avx512vl(auVar55,auVar68,auVar56);
    auVar57._0_4_ = auVar69._0_4_ + auVar58._0_4_;
    auVar57._4_4_ = auVar69._4_4_ + auVar58._4_4_;
    auVar57._8_4_ = auVar69._8_4_ + auVar58._8_4_;
    auVar57._12_4_ = auVar69._12_4_ + auVar58._12_4_;
    auVar57._16_4_ = auVar69._16_4_ + auVar58._16_4_;
    auVar57._20_4_ = auVar69._20_4_ + auVar58._20_4_;
    auVar57._24_4_ = auVar69._24_4_ + auVar58._24_4_;
    auVar57._28_4_ = auVar69._28_4_ + auVar58._28_4_;
    auVar55 = vaddps_avx512vl(auVar60,auVar41);
    auVar53 = vaddps_avx512vl(auVar64,auVar59);
    auVar54 = vmulps_avx512vl(auVar55,auVar49);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar53);
    auVar53 = vmulps_avx512vl(auVar53,auVar47);
    auVar56 = vfmsub231ps_avx512vl(auVar53,auVar49,auVar57);
    auVar53 = vmulps_avx512vl(auVar57,auVar48);
    auVar55 = vfmsub231ps_avx512vl(auVar53,auVar47,auVar55);
    auVar53._4_4_ = fVar12 * auVar55._4_4_;
    auVar53._0_4_ = fVar12 * auVar55._0_4_;
    auVar53._8_4_ = fVar12 * auVar55._8_4_;
    auVar53._12_4_ = fVar12 * auVar55._12_4_;
    auVar53._16_4_ = fVar12 * auVar55._16_4_;
    auVar53._20_4_ = fVar12 * auVar55._20_4_;
    auVar53._24_4_ = fVar12 * auVar55._24_4_;
    auVar53._28_4_ = auVar55._28_4_;
    auVar55 = vfmadd231ps_avx512vl(auVar53,auVar71,auVar56);
    local_920 = vfmadd231ps_avx512vl(auVar55,auVar68,auVar54);
    auVar58 = vaddps_avx512vl(auVar58,auVar42);
    auVar42 = vaddps_avx512vl(auVar41,auVar43);
    auVar55 = vaddps_avx512vl(auVar59,auVar40);
    auVar59 = vmulps_avx512vl(auVar42,auVar52);
    auVar53 = vfmsub231ps_avx512vl(auVar59,auVar51,auVar55);
    auVar59._4_4_ = auVar55._4_4_ * auVar50._4_4_;
    auVar59._0_4_ = auVar55._0_4_ * auVar50._0_4_;
    auVar59._8_4_ = auVar55._8_4_ * auVar50._8_4_;
    auVar59._12_4_ = auVar55._12_4_ * auVar50._12_4_;
    auVar59._16_4_ = auVar55._16_4_ * auVar50._16_4_;
    auVar59._20_4_ = auVar55._20_4_ * auVar50._20_4_;
    auVar59._24_4_ = auVar55._24_4_ * auVar50._24_4_;
    auVar59._28_4_ = auVar55._28_4_;
    auVar37 = vfmsub231ps_fma(auVar59,auVar52,auVar58);
    auVar40._4_4_ = auVar58._4_4_ * auVar51._4_4_;
    auVar40._0_4_ = auVar58._0_4_ * auVar51._0_4_;
    auVar40._8_4_ = auVar58._8_4_ * auVar51._8_4_;
    auVar40._12_4_ = auVar58._12_4_ * auVar51._12_4_;
    auVar40._16_4_ = auVar58._16_4_ * auVar51._16_4_;
    auVar40._20_4_ = auVar58._20_4_ * auVar51._20_4_;
    auVar40._24_4_ = auVar58._24_4_ * auVar51._24_4_;
    auVar40._28_4_ = auVar58._28_4_;
    auVar58 = vfmsub231ps_avx512vl(auVar40,auVar50,auVar42);
    auVar58 = vmulps_avx512vl(auVar58,auVar73);
    auVar58 = vfmadd231ps_avx512vl(auVar58,auVar71,ZEXT1632(auVar37));
    auVar59 = vfmadd231ps_avx512vl(auVar58,auVar68,auVar53);
    auVar41._0_4_ = local_940._0_4_ + local_920._0_4_;
    auVar41._4_4_ = local_940._4_4_ + local_920._4_4_;
    auVar41._8_4_ = local_940._8_4_ + local_920._8_4_;
    auVar41._12_4_ = local_940._12_4_ + local_920._12_4_;
    auVar41._16_4_ = local_940._16_4_ + local_920._16_4_;
    auVar41._20_4_ = local_940._20_4_ + local_920._20_4_;
    auVar41._24_4_ = local_940._24_4_ + local_920._24_4_;
    auVar41._28_4_ = local_940._28_4_ + local_920._28_4_;
    local_900 = vaddps_avx512vl(auVar59,auVar41);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    vandps_avx512vl(local_900,auVar55);
    auVar58._8_4_ = 0x34000000;
    auVar58._0_8_ = 0x3400000034000000;
    auVar58._12_4_ = 0x34000000;
    auVar58._16_4_ = 0x34000000;
    auVar58._20_4_ = 0x34000000;
    auVar58._24_4_ = 0x34000000;
    auVar58._28_4_ = 0x34000000;
    auVar58 = vmulps_avx512vl(auVar55,auVar58);
    auVar42 = vminps_avx512vl(local_940,local_920);
    auVar53 = vminps_avx512vl(auVar42,auVar59);
    auVar42._8_4_ = 0x80000000;
    auVar42._0_8_ = 0x8000000080000000;
    auVar42._12_4_ = 0x80000000;
    auVar42._16_4_ = 0x80000000;
    auVar42._20_4_ = 0x80000000;
    auVar42._24_4_ = 0x80000000;
    auVar42._28_4_ = 0x80000000;
    auVar42 = vxorps_avx512vl(auVar58,auVar42);
    uVar20 = vcmpps_avx512vl(auVar53,auVar42,5);
    auVar42 = vmaxps_avx512vl(local_940,local_920);
    auVar42 = vmaxps_avx512vl(auVar42,auVar59);
    uVar21 = vcmpps_avx512vl(auVar42,auVar58,2);
    bVar22 = (byte)uVar20 | (byte)uVar21;
    if (bVar22 != 0) {
      auVar58 = vmulps_avx512vl(auVar48,auVar46);
      auVar42 = vmulps_avx512vl(auVar44,auVar49);
      auVar59 = vmulps_avx512vl(auVar47,auVar45);
      auVar53 = vmulps_avx512vl(auVar51,auVar49);
      auVar40 = vmulps_avx512vl(auVar47,auVar52);
      auVar41 = vmulps_avx512vl(auVar50,auVar48);
      auVar43 = vfmsub213ps_avx512vl(auVar45,auVar49,auVar58);
      auVar45 = vfmsub213ps_avx512vl(auVar46,auVar47,auVar42);
      auVar44 = vfmsub213ps_avx512vl(auVar44,auVar48,auVar59);
      auVar46 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar53);
      auVar48 = vfmsub213ps_avx512vl(auVar50,auVar49,auVar40);
      auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar41);
      vandps_avx512vl(auVar58,auVar55);
      vandps_avx512vl(auVar53,auVar55);
      uVar28 = vcmpps_avx512vl(auVar47,auVar47,1);
      vandps_avx512vl(auVar42,auVar55);
      vandps_avx512vl(auVar40,auVar55);
      uVar31 = vcmpps_avx512vl(auVar47,auVar47,1);
      vandps_avx512vl(auVar59,auVar55);
      vandps_avx512vl(auVar41,auVar55);
      uVar26 = vcmpps_avx512vl(auVar47,auVar47,1);
      bVar19 = (bool)((byte)uVar28 & 1);
      local_860._0_4_ = (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar46._0_4_;
      bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
      local_860._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar46._4_4_;
      bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
      local_860._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar46._8_4_;
      bVar19 = (bool)((byte)(uVar28 >> 3) & 1);
      local_860._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar46._12_4_;
      bVar19 = (bool)((byte)(uVar28 >> 4) & 1);
      local_860._16_4_ = (uint)bVar19 * auVar43._16_4_ | (uint)!bVar19 * auVar46._16_4_;
      bVar19 = (bool)((byte)(uVar28 >> 5) & 1);
      local_860._20_4_ = (uint)bVar19 * auVar43._20_4_ | (uint)!bVar19 * auVar46._20_4_;
      bVar19 = (bool)((byte)(uVar28 >> 6) & 1);
      local_860._24_4_ = (uint)bVar19 * auVar43._24_4_ | (uint)!bVar19 * auVar46._24_4_;
      bVar19 = SUB81(uVar28 >> 7,0);
      local_860._28_4_ = (uint)bVar19 * auVar43._28_4_ | (uint)!bVar19 * auVar46._28_4_;
      bVar19 = (bool)((byte)uVar31 & 1);
      local_840._0_4_ = (uint)bVar19 * auVar45._0_4_ | (uint)!bVar19 * auVar48._0_4_;
      bVar19 = (bool)((byte)(uVar31 >> 1) & 1);
      local_840._4_4_ = (uint)bVar19 * auVar45._4_4_ | (uint)!bVar19 * auVar48._4_4_;
      bVar19 = (bool)((byte)(uVar31 >> 2) & 1);
      local_840._8_4_ = (uint)bVar19 * auVar45._8_4_ | (uint)!bVar19 * auVar48._8_4_;
      bVar19 = (bool)((byte)(uVar31 >> 3) & 1);
      local_840._12_4_ = (uint)bVar19 * auVar45._12_4_ | (uint)!bVar19 * auVar48._12_4_;
      bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
      local_840._16_4_ = (uint)bVar19 * auVar45._16_4_ | (uint)!bVar19 * auVar48._16_4_;
      bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
      local_840._20_4_ = (uint)bVar19 * auVar45._20_4_ | (uint)!bVar19 * auVar48._20_4_;
      bVar19 = (bool)((byte)(uVar31 >> 6) & 1);
      local_840._24_4_ = (uint)bVar19 * auVar45._24_4_ | (uint)!bVar19 * auVar48._24_4_;
      bVar19 = SUB81(uVar31 >> 7,0);
      local_840._28_4_ = (uint)bVar19 * auVar45._28_4_ | (uint)!bVar19 * auVar48._28_4_;
      bVar19 = (bool)((byte)uVar26 & 1);
      local_820._0_4_ = (float)((uint)bVar19 * auVar44._0_4_ | (uint)!bVar19 * auVar47._0_4_);
      bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
      local_820._4_4_ = (float)((uint)bVar19 * auVar44._4_4_ | (uint)!bVar19 * auVar47._4_4_);
      bVar19 = (bool)((byte)(uVar26 >> 2) & 1);
      local_820._8_4_ = (float)((uint)bVar19 * auVar44._8_4_ | (uint)!bVar19 * auVar47._8_4_);
      bVar19 = (bool)((byte)(uVar26 >> 3) & 1);
      local_820._12_4_ = (float)((uint)bVar19 * auVar44._12_4_ | (uint)!bVar19 * auVar47._12_4_);
      bVar19 = (bool)((byte)(uVar26 >> 4) & 1);
      local_820._16_4_ = (float)((uint)bVar19 * auVar44._16_4_ | (uint)!bVar19 * auVar47._16_4_);
      bVar19 = (bool)((byte)(uVar26 >> 5) & 1);
      local_820._20_4_ = (float)((uint)bVar19 * auVar44._20_4_ | (uint)!bVar19 * auVar47._20_4_);
      bVar19 = (bool)((byte)(uVar26 >> 6) & 1);
      local_820._24_4_ = (float)((uint)bVar19 * auVar44._24_4_ | (uint)!bVar19 * auVar47._24_4_);
      bVar19 = SUB81(uVar26 >> 7,0);
      local_820._28_4_ = (uint)bVar19 * auVar44._28_4_ | (uint)!bVar19 * auVar47._28_4_;
      auVar51._4_4_ = fVar12 * local_820._4_4_;
      auVar51._0_4_ = fVar12 * local_820._0_4_;
      auVar51._8_4_ = fVar12 * local_820._8_4_;
      auVar51._12_4_ = fVar12 * local_820._12_4_;
      auVar51._16_4_ = fVar12 * local_820._16_4_;
      auVar51._20_4_ = fVar12 * local_820._20_4_;
      auVar51._24_4_ = fVar12 * local_820._24_4_;
      auVar51._28_4_ = fVar12;
      auVar37 = vfmadd213ps_fma(auVar71,local_840,auVar51);
      auVar37 = vfmadd213ps_fma(auVar68,local_860,ZEXT1632(auVar37));
      auVar59 = ZEXT1632(CONCAT412(auVar37._12_4_ + auVar37._12_4_,
                                   CONCAT48(auVar37._8_4_ + auVar37._8_4_,
                                            CONCAT44(auVar37._4_4_ + auVar37._4_4_,
                                                     auVar37._0_4_ + auVar37._0_4_))));
      auVar52._0_4_ = auVar64._0_4_ * local_820._0_4_;
      auVar52._4_4_ = auVar64._4_4_ * local_820._4_4_;
      auVar52._8_4_ = auVar64._8_4_ * local_820._8_4_;
      auVar52._12_4_ = auVar64._12_4_ * local_820._12_4_;
      auVar52._16_4_ = auVar64._16_4_ * local_820._16_4_;
      auVar52._20_4_ = auVar64._20_4_ * local_820._20_4_;
      auVar52._24_4_ = auVar64._24_4_ * local_820._24_4_;
      auVar52._28_4_ = 0;
      auVar37 = vfmadd213ps_fma(auVar60,local_840,auVar52);
      auVar38 = vfmadd213ps_fma(auVar69,local_860,ZEXT1632(auVar37));
      auVar58 = vrcp14ps_avx512vl(auVar59);
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = 0x3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      auVar69._16_4_ = 0x3f800000;
      auVar69._20_4_ = 0x3f800000;
      auVar69._24_4_ = 0x3f800000;
      auVar69._28_4_ = 0x3f800000;
      auVar42 = vfnmadd213ps_avx512vl(auVar58,auVar59,auVar69);
      auVar37 = vfmadd132ps_fma(auVar42,auVar58,auVar58);
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_a00._4_4_ = uVar11;
      local_a00._0_4_ = uVar11;
      local_a00._8_4_ = uVar11;
      local_a00._12_4_ = uVar11;
      local_a00._16_4_ = uVar11;
      local_a00._20_4_ = uVar11;
      local_a00._24_4_ = uVar11;
      local_a00._28_4_ = uVar11;
      auVar74 = ZEXT3264(local_a00);
      local_880 = ZEXT1632(CONCAT412(auVar37._12_4_ * (auVar38._12_4_ + auVar38._12_4_),
                                     CONCAT48(auVar37._8_4_ * (auVar38._8_4_ + auVar38._8_4_),
                                              CONCAT44(auVar37._4_4_ *
                                                       (auVar38._4_4_ + auVar38._4_4_),
                                                       auVar37._0_4_ *
                                                       (auVar38._0_4_ + auVar38._0_4_)))));
      uVar20 = vcmpps_avx512vl(local_880,local_a00,2);
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar50._4_4_ = uVar11;
      auVar50._0_4_ = uVar11;
      auVar50._8_4_ = uVar11;
      auVar50._12_4_ = uVar11;
      auVar50._16_4_ = uVar11;
      auVar50._20_4_ = uVar11;
      auVar50._24_4_ = uVar11;
      auVar50._28_4_ = uVar11;
      uVar21 = vcmpps_avx512vl(local_880,auVar50,0xd);
      bVar22 = (byte)uVar20 & (byte)uVar21 & bVar22;
      if (bVar22 != 0) {
        local_ac8 = vcmpps_avx512vl(auVar59,ZEXT832(0) << 0x20,4);
        local_ac8 = bVar22 & local_ac8;
        local_8d8 = (char)local_ac8;
        if (local_8d8 != '\0') {
          local_8e0 = &local_af8;
          pGVar17 = (context->scene->geometries).items[*(uint *)(pGVar29 + 0x18)].ptr;
          if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01ce609e:
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_01ce60aa;
            }
            auVar56._8_4_ = 0x219392ef;
            auVar56._0_8_ = 0x219392ef219392ef;
            auVar56._12_4_ = 0x219392ef;
            auVar56._16_4_ = 0x219392ef;
            auVar56._20_4_ = 0x219392ef;
            auVar56._24_4_ = 0x219392ef;
            auVar56._28_4_ = 0x219392ef;
            uVar28 = vcmpps_avx512vl(auVar55,auVar56,5);
            auVar37 = *(undefined1 (*) [16])(local_af8 + local_af0 * 4);
            auVar38 = auVar37;
            if (2 < local_ae8) {
              auVar38 = *(undefined1 (*) [16])(local_af8 + local_af0 * 8);
            }
            auVar39 = *(undefined1 (*) [16])local_af8;
            if (local_af0 == 2) {
              auVar39 = vpshufd_avx(auVar39,0x54);
              auVar37 = vpshufd_avx(auVar37,0x54);
              auVar38 = vpshufd_avx(auVar38,0x54);
            }
            auVar58 = vrcp14ps_avx512vl(local_900);
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar72._16_4_ = 0x3f800000;
            auVar72._20_4_ = 0x3f800000;
            auVar72._24_4_ = 0x3f800000;
            auVar72._28_4_ = 0x3f800000;
            auVar61 = vfnmadd213ps_fma(local_900,auVar58,auVar72);
            auVar58 = vfmadd132ps_avx512vl(ZEXT1632(auVar61),auVar58,auVar58);
            fVar1 = (float)((uint)((byte)uVar28 & 1) * auVar58._0_4_);
            fVar12 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar58._4_4_);
            fVar2 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar58._8_4_);
            fVar3 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar58._12_4_);
            fVar4 = (float)((uint)((byte)(uVar28 >> 4) & 1) * auVar58._16_4_);
            fVar5 = (float)((uint)((byte)(uVar28 >> 5) & 1) * auVar58._20_4_);
            fVar6 = (float)((uint)((byte)(uVar28 >> 6) & 1) * auVar58._24_4_);
            auVar24._4_4_ = local_940._4_4_ * fVar12;
            auVar24._0_4_ = local_940._0_4_ * fVar1;
            auVar24._8_4_ = local_940._8_4_ * fVar2;
            auVar24._12_4_ = local_940._12_4_ * fVar3;
            auVar24._16_4_ = local_940._16_4_ * fVar4;
            auVar24._20_4_ = local_940._20_4_ * fVar5;
            auVar24._24_4_ = local_940._24_4_ * fVar6;
            auVar24._28_4_ = local_940._28_4_;
            auVar60 = vminps_avx(auVar24,auVar72);
            auVar25._4_4_ = fVar12 * local_920._4_4_;
            auVar25._0_4_ = fVar1 * local_920._0_4_;
            auVar25._8_4_ = fVar2 * local_920._8_4_;
            auVar25._12_4_ = fVar3 * local_920._12_4_;
            auVar25._16_4_ = fVar4 * local_920._16_4_;
            auVar25._20_4_ = fVar5 * local_920._20_4_;
            auVar25._24_4_ = fVar6 * local_920._24_4_;
            auVar25._28_4_ = local_920._28_4_;
            auVar64 = vminps_avx(auVar25,auVar72);
            auVar65._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar39;
            auVar65._16_16_ = ZEXT116(1) * auVar37;
            auVar66._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar37;
            auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
            auVar58 = vpunpckldq_avx2(auVar65,auVar66);
            auVar59 = vpshufd_avx2(auVar65,0xa5);
            auVar53 = vpshufd_avx2(auVar66,0x94);
            auVar42 = vpsrld_avx2(auVar58,0x10);
            auVar58 = vpblendw_avx2(auVar58,ZEXT832(0) << 0x20,0xaa);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar42 = vcvtdq2ps_avx(auVar42);
            auVar55 = vpsrld_avx2(auVar59,0x10);
            auVar59 = vpblendw_avx2(auVar59,ZEXT832(0) << 0x20,0xaa);
            auVar59 = vcvtdq2ps_avx(auVar59);
            auVar55 = vcvtdq2ps_avx(auVar55);
            auVar69 = vpsrld_avx2(auVar53,0x10);
            auVar53 = vpblendw_avx2(auVar53,ZEXT832(0) << 0x20,0xaa);
            auVar53 = vcvtdq2ps_avx(auVar53);
            auVar69 = vcvtdq2ps_avx(auVar69);
            auVar40 = vsubps_avx(auVar72,auVar60);
            auVar40 = vsubps_avx(auVar40,auVar64);
            local_8c0._0_4_ =
                 auVar64._0_4_ * auVar53._0_4_ * 0.00012207031 +
                 auVar60._0_4_ * auVar59._0_4_ * 0.00012207031 +
                 auVar40._0_4_ * auVar58._0_4_ * 0.00012207031;
            local_8c0._4_4_ =
                 auVar64._4_4_ * auVar53._4_4_ * 0.00012207031 +
                 auVar60._4_4_ * auVar59._4_4_ * 0.00012207031 +
                 auVar40._4_4_ * auVar58._4_4_ * 0.00012207031;
            local_8c0._8_4_ =
                 auVar64._8_4_ * auVar53._8_4_ * 0.00012207031 +
                 auVar60._8_4_ * auVar59._8_4_ * 0.00012207031 +
                 auVar40._8_4_ * auVar58._8_4_ * 0.00012207031;
            local_8c0._12_4_ =
                 auVar64._12_4_ * auVar53._12_4_ * 0.00012207031 +
                 auVar60._12_4_ * auVar59._12_4_ * 0.00012207031 +
                 auVar40._12_4_ * auVar58._12_4_ * 0.00012207031;
            local_8c0._16_4_ =
                 auVar64._16_4_ * auVar53._16_4_ * 0.00012207031 +
                 auVar60._16_4_ * auVar59._16_4_ * 0.00012207031 +
                 auVar40._16_4_ * auVar58._16_4_ * 0.00012207031;
            local_8c0._20_4_ =
                 auVar64._20_4_ * auVar53._20_4_ * 0.00012207031 +
                 auVar60._20_4_ * auVar59._20_4_ * 0.00012207031 +
                 auVar40._20_4_ * auVar58._20_4_ * 0.00012207031;
            local_8c0._24_4_ =
                 auVar64._24_4_ * auVar53._24_4_ * 0.00012207031 +
                 auVar60._24_4_ * auVar59._24_4_ * 0.00012207031 +
                 auVar40._24_4_ * auVar58._24_4_ * 0.00012207031;
            local_8c0._28_4_ = auVar53._28_4_ + auVar59._28_4_ + auVar64._28_4_;
            local_8a0[0] = auVar64._0_4_ * auVar69._0_4_ * 0.00012207031 +
                           auVar60._0_4_ * auVar55._0_4_ * 0.00012207031 +
                           auVar40._0_4_ * auVar42._0_4_ * 0.00012207031;
            local_8a0[1] = auVar64._4_4_ * auVar69._4_4_ * 0.00012207031 +
                           auVar60._4_4_ * auVar55._4_4_ * 0.00012207031 +
                           auVar40._4_4_ * auVar42._4_4_ * 0.00012207031;
            local_8a0[2] = auVar64._8_4_ * auVar69._8_4_ * 0.00012207031 +
                           auVar60._8_4_ * auVar55._8_4_ * 0.00012207031 +
                           auVar40._8_4_ * auVar42._8_4_ * 0.00012207031;
            local_8a0[3] = auVar64._12_4_ * auVar69._12_4_ * 0.00012207031 +
                           auVar60._12_4_ * auVar55._12_4_ * 0.00012207031 +
                           auVar40._12_4_ * auVar42._12_4_ * 0.00012207031;
            fStack_890 = auVar64._16_4_ * auVar69._16_4_ * 0.00012207031 +
                         auVar60._16_4_ * auVar55._16_4_ * 0.00012207031 +
                         auVar40._16_4_ * auVar42._16_4_ * 0.00012207031;
            fStack_88c = auVar64._20_4_ * auVar69._20_4_ * 0.00012207031 +
                         auVar60._20_4_ * auVar55._20_4_ * 0.00012207031 +
                         auVar40._20_4_ * auVar42._20_4_ * 0.00012207031;
            fStack_888 = auVar64._24_4_ * auVar69._24_4_ * 0.00012207031 +
                         auVar60._24_4_ * auVar55._24_4_ * 0.00012207031 +
                         auVar40._24_4_ * auVar42._24_4_ * 0.00012207031;
            fStack_884 = auVar53._28_4_ + auVar55._28_4_ + auVar40._28_4_;
            uVar28 = 0;
            for (uVar31 = local_ac8; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              uVar28 = uVar28 + 1;
            }
            local_a20 = vpbroadcastd_avx512vl();
            local_a30 = vpbroadcastd_avx512vl();
            while (local_ac8 != 0) {
              fVar12 = local_8a0[uVar28 - 8];
              local_9a0._4_4_ = fVar12;
              local_9a0._0_4_ = fVar12;
              local_9a0._8_4_ = fVar12;
              local_9a0._12_4_ = fVar12;
              fVar12 = local_8a0[uVar28];
              local_990._4_4_ = fVar12;
              local_990._0_4_ = fVar12;
              local_990._8_4_ = fVar12;
              local_990._12_4_ = fVar12;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + uVar28 * 4);
              local_a60.context = context->user;
              local_9d0 = *(undefined4 *)(local_860 + uVar28 * 4);
              uVar11 = *(undefined4 *)(local_840 + uVar28 * 4);
              local_9c0._4_4_ = uVar11;
              local_9c0._0_4_ = uVar11;
              local_9c0._8_4_ = uVar11;
              local_9c0._12_4_ = uVar11;
              uVar11 = *(undefined4 *)(local_820 + uVar28 * 4);
              local_9b0._4_4_ = uVar11;
              local_9b0._0_4_ = uVar11;
              local_9b0._8_4_ = uVar11;
              local_9b0._12_4_ = uVar11;
              local_980 = local_a30._0_8_;
              uStack_978 = local_a30._8_8_;
              local_970 = local_a20;
              vpcmpeqd_avx2(ZEXT1632(local_a20),ZEXT1632(local_a20));
              uStack_95c = (local_a60.context)->instID[0];
              local_960 = uStack_95c;
              uStack_958 = uStack_95c;
              uStack_954 = uStack_95c;
              uStack_950 = (local_a60.context)->instPrimID[0];
              uStack_94c = uStack_950;
              uStack_948 = uStack_950;
              uStack_944 = uStack_950;
              local_ae0 = local_a10;
              local_a60.valid = (int *)local_ae0;
              local_a60.geometryUserPtr = pGVar17->userPtr;
              local_a60.hit = (RTCHitN *)&local_9d0;
              local_a60.N = 4;
              local_a60.ray = (RTCRayN *)ray;
              uStack_9cc = local_9d0;
              uStack_9c8 = local_9d0;
              uStack_9c4 = local_9d0;
              if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar17->occlusionFilterN)(&local_a60);
                auVar74 = ZEXT3264(local_a00);
                auVar80 = ZEXT1664(local_ac0);
                auVar79 = ZEXT1664(local_ab0);
                auVar78 = ZEXT1664(local_aa0);
                auVar77 = ZEXT1664(local_a90);
                auVar76 = ZEXT1664(local_a80);
                auVar75 = ZEXT1664(local_a70);
              }
              uVar31 = vptestmd_avx512vl(local_ae0,local_ae0);
              if ((uVar31 & 0xf) != 0) {
                p_Var18 = context->args->filter;
                if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var18)(&local_a60);
                  auVar74 = ZEXT3264(local_a00);
                  auVar80 = ZEXT1664(local_ac0);
                  auVar79 = ZEXT1664(local_ab0);
                  auVar78 = ZEXT1664(local_aa0);
                  auVar77 = ZEXT1664(local_a90);
                  auVar76 = ZEXT1664(local_a80);
                  auVar75 = ZEXT1664(local_a70);
                }
                auVar37 = *(undefined1 (*) [16])(local_a60.ray + 0x80);
                uVar31 = vptestmd_avx512vl(local_ae0,local_ae0);
                uVar31 = uVar31 & 0xf;
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar19 = (bool)((byte)uVar31 & 1);
                auVar39._0_4_ = (uint)bVar19 * auVar38._0_4_ | (uint)!bVar19 * auVar37._0_4_;
                bVar19 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar19 * auVar38._4_4_ | (uint)!bVar19 * auVar37._4_4_;
                bVar19 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar19 * auVar38._8_4_ | (uint)!bVar19 * auVar37._8_4_;
                bVar19 = SUB81(uVar31 >> 3,0);
                auVar39._12_4_ = (uint)bVar19 * auVar38._12_4_ | (uint)!bVar19 * auVar37._12_4_;
                *(undefined1 (*) [16])(local_a60.ray + 0x80) = auVar39;
                if ((byte)uVar31 != 0) goto LAB_01ce609e;
              }
              *(int *)(ray + k * 4 + 0x80) = auVar74._0_4_;
              uVar31 = uVar28 & 0x3f;
              uVar28 = 0;
              local_ac8 = local_ac8 ^ 1L << uVar31;
              for (uVar31 = local_ac8; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
              {
                uVar28 = uVar28 + 1;
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }